

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

void embree::avx::DiscMiIntersectorK<4,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  undefined1 auVar7 [32];
  uint uVar8;
  undefined4 uVar9;
  RayHitK<4> *pRVar10;
  long lVar12;
  Scene *pSVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar19;
  float fVar20;
  undefined1 auVar17 [16];
  float fVar21;
  undefined1 auVar18 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  float fVar40;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  undefined1 auVar49 [16];
  undefined1 auVar51 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  RayQueryContext *local_1c8;
  Scene *local_1c0;
  undefined1 *local_1b8;
  void *local_1b0;
  RTCRayQueryContext *local_1a8;
  RayHitK<4> *local_1a0;
  undefined1 (*local_198) [16];
  undefined4 local_190;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [32];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  float local_118 [4];
  float local_108 [4];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  undefined1 local_88 [16];
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined1 local_58 [32];
  ulong uVar11;
  undefined1 auVar34 [64];
  undefined1 auVar50 [64];
  
  pSVar13 = context->scene;
  pGVar5 = (pSVar13->geometries).items[Disc->sharedGeomID].ptr;
  lVar12 = *(long *)&pGVar5->field_0x58;
  _Var6 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar14 = *(undefined1 (*) [16])(lVar12 + (Disc->primIDs).field_0.i[0] * _Var6);
  auVar37 = *(undefined1 (*) [16])(lVar12 + (Disc->primIDs).field_0.i[1] * _Var6);
  auVar31 = *(undefined1 (*) [16])(lVar12 + (Disc->primIDs).field_0.i[2] * _Var6);
  auVar30 = *(undefined1 (*) [16])(lVar12 + (Disc->primIDs).field_0.i[3] * _Var6);
  auVar15 = vunpcklps_avx(auVar14,auVar31);
  auVar18 = vunpckhps_avx(auVar14,auVar31);
  auVar14 = vunpcklps_avx(auVar37,auVar30);
  auVar38 = vunpckhps_avx(auVar37,auVar30);
  auVar30 = vunpcklps_avx(auVar15,auVar14);
  auVar37 = vunpckhps_avx(auVar15,auVar14);
  auVar32 = vunpcklps_avx(auVar18,auVar38);
  auVar14 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar31 = vpcmpgtd_avx(auVar14,_DAT_01f7fcf0);
  local_f8 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  uVar9 = *(undefined4 *)(ray + k * 4);
  auVar17._4_4_ = uVar9;
  auVar17._0_4_ = uVar9;
  auVar17._8_4_ = uVar9;
  auVar17._12_4_ = uVar9;
  auVar30 = vsubps_avx(auVar30,auVar17);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar15._4_4_ = uVar9;
  auVar15._0_4_ = uVar9;
  auVar15._8_4_ = uVar9;
  auVar15._12_4_ = uVar9;
  auVar15 = vsubps_avx(auVar37,auVar15);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar14._4_4_ = uVar9;
  auVar14._0_4_ = uVar9;
  auVar14._8_4_ = uVar9;
  auVar14._12_4_ = uVar9;
  auVar32 = vsubps_avx(auVar32,auVar14);
  fVar1 = *(float *)(ray + k * 4 + 0x40);
  fVar2 = *(float *)(ray + k * 4 + 0x50);
  fVar3 = *(float *)(ray + k * 4 + 0x60);
  auVar14 = ZEXT416((uint)(fVar1 * fVar1 + fVar2 * fVar2 + fVar3 * fVar3));
  auVar37 = vshufps_avx(auVar14,auVar14,0);
  auVar14 = vrcpps_avx(auVar37);
  fVar40 = auVar14._0_4_;
  auVar36._0_4_ = fVar40 * auVar37._0_4_;
  fVar44 = auVar14._4_4_;
  auVar36._4_4_ = fVar44 * auVar37._4_4_;
  fVar45 = auVar14._8_4_;
  auVar36._8_4_ = fVar45 * auVar37._8_4_;
  fVar46 = auVar14._12_4_;
  auVar36._12_4_ = fVar46 * auVar37._12_4_;
  auVar47._8_4_ = 0x3f800000;
  auVar47._0_8_ = 0x3f8000003f800000;
  auVar47._12_4_ = 0x3f800000;
  auVar14 = vsubps_avx(auVar47,auVar36);
  fVar26 = auVar32._0_4_;
  fVar27 = auVar32._4_4_;
  fVar28 = auVar32._8_4_;
  fVar29 = auVar32._12_4_;
  fVar22 = auVar15._0_4_;
  fVar23 = auVar15._4_4_;
  fVar24 = auVar15._8_4_;
  fVar25 = auVar15._12_4_;
  fVar16 = auVar30._0_4_;
  fVar19 = auVar30._4_4_;
  fVar20 = auVar30._8_4_;
  fVar21 = auVar30._12_4_;
  local_138._0_4_ =
       (fVar16 * fVar1 + fVar22 * fVar2 + fVar26 * fVar3) * (fVar40 + fVar40 * auVar14._0_4_);
  local_138._4_4_ =
       (fVar19 * fVar1 + fVar23 * fVar2 + fVar27 * fVar3) * (fVar44 + fVar44 * auVar14._4_4_);
  local_138._8_4_ =
       (fVar20 * fVar1 + fVar24 * fVar2 + fVar28 * fVar3) * (fVar45 + fVar45 * auVar14._8_4_);
  local_138._12_4_ =
       (fVar21 * fVar1 + fVar25 * fVar2 + fVar29 * fVar3) * (fVar46 + fVar46 * auVar14._12_4_);
  auVar48 = ZEXT1664(local_138);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar37._4_4_ = uVar9;
  auVar37._0_4_ = uVar9;
  auVar37._8_4_ = uVar9;
  auVar37._12_4_ = uVar9;
  auVar14 = vcmpps_avx(auVar37,local_138,2);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar49._4_4_ = uVar9;
  auVar49._0_4_ = uVar9;
  auVar49._8_4_ = uVar9;
  auVar49._12_4_ = uVar9;
  auVar50 = ZEXT1664(auVar49);
  auVar37 = vcmpps_avx(local_138,auVar49,2);
  auVar14 = vandps_avx(auVar37,auVar14);
  auVar37 = auVar31 & auVar14;
  if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar37[0xf] < '\0') {
    auVar14 = vandps_avx(auVar14,auVar31);
    auVar18 = vunpckhps_avx(auVar18,auVar38);
    auVar31._0_4_ = local_138._0_4_ * fVar1;
    auVar31._4_4_ = local_138._4_4_ * fVar1;
    auVar31._8_4_ = local_138._8_4_ * fVar1;
    auVar31._12_4_ = local_138._12_4_ * fVar1;
    auVar38._0_4_ = local_138._0_4_ * fVar2;
    auVar38._4_4_ = local_138._4_4_ * fVar2;
    auVar38._8_4_ = local_138._8_4_ * fVar2;
    auVar38._12_4_ = local_138._12_4_ * fVar2;
    auVar41._0_4_ = local_138._0_4_ * fVar3;
    auVar41._4_4_ = local_138._4_4_ * fVar3;
    auVar41._8_4_ = local_138._8_4_ * fVar3;
    auVar41._12_4_ = local_138._12_4_ * fVar3;
    auVar37 = vsubps_avx(auVar30,auVar31);
    auVar31 = vsubps_avx(auVar15,auVar38);
    auVar30 = vsubps_avx(auVar32,auVar41);
    auVar42._0_4_ = auVar30._0_4_ * auVar30._0_4_;
    auVar42._4_4_ = auVar30._4_4_ * auVar30._4_4_;
    auVar42._8_4_ = auVar30._8_4_ * auVar30._8_4_;
    auVar42._12_4_ = auVar30._12_4_ * auVar30._12_4_;
    auVar32._0_4_ = auVar31._0_4_ * auVar31._0_4_ + auVar42._0_4_ + auVar37._0_4_ * auVar37._0_4_;
    auVar32._4_4_ = auVar31._4_4_ * auVar31._4_4_ + auVar42._4_4_ + auVar37._4_4_ * auVar37._4_4_;
    auVar32._8_4_ = auVar31._8_4_ * auVar31._8_4_ + auVar42._8_4_ + auVar37._8_4_ * auVar37._8_4_;
    auVar32._12_4_ =
         auVar31._12_4_ * auVar31._12_4_ + auVar42._12_4_ + auVar37._12_4_ * auVar37._12_4_;
    auVar30._0_4_ = auVar18._0_4_ * auVar18._0_4_;
    auVar30._4_4_ = auVar18._4_4_ * auVar18._4_4_;
    auVar30._8_4_ = auVar18._8_4_ * auVar18._8_4_;
    auVar30._12_4_ = auVar18._12_4_ * auVar18._12_4_;
    auVar37 = vcmpps_avx(auVar32,auVar30,2);
    auVar31 = auVar14 & auVar37;
    if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar31[0xf] < '\0')
    {
      auVar14 = vandps_avx(auVar14,auVar37);
      auVar18._0_4_ = fVar16 * fVar16 + fVar22 * fVar22 + fVar26 * fVar26;
      auVar18._4_4_ = fVar19 * fVar19 + fVar23 * fVar23 + fVar27 * fVar27;
      auVar18._8_4_ = fVar20 * fVar20 + fVar24 * fVar24 + fVar28 * fVar28;
      auVar18._12_4_ = fVar21 * fVar21 + fVar25 * fVar25 + fVar29 * fVar29;
      auVar37 = vcmpps_avx(auVar18,auVar30,6);
      auVar31 = auVar37 & auVar14;
      if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar31[0xf] < '\0'
         ) {
        local_1e8 = vandps_avx(auVar14,auVar37);
        local_128._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
        local_128._8_4_ = -fVar1;
        local_128._12_4_ = -fVar1;
        local_158 = ZEXT832(0) << 0x20;
        local_118[0] = -fVar2;
        local_118[1] = -fVar2;
        local_118[2] = -fVar2;
        local_118[3] = -fVar2;
        local_108[0] = -fVar3;
        local_108[1] = -fVar3;
        local_108[2] = -fVar3;
        local_108[3] = -fVar3;
        auVar33._8_4_ = 0x7f800000;
        auVar33._0_8_ = 0x7f8000007f800000;
        auVar33._12_4_ = 0x7f800000;
        auVar34 = ZEXT1664(auVar33);
        auVar14 = vblendvps_avx(auVar33,local_138,local_1e8);
        auVar37 = vshufps_avx(auVar14,auVar14,0xb1);
        auVar37 = vminps_avx(auVar37,auVar14);
        auVar31 = vshufpd_avx(auVar37,auVar37,1);
        auVar37 = vminps_avx(auVar31,auVar37);
        auVar37 = vcmpps_avx(auVar14,auVar37,0);
        auVar31 = local_1e8 & auVar37;
        auVar14 = local_1e8;
        if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar31[0xf] < '\0') {
          auVar14 = vandps_avx(auVar37,local_1e8);
        }
        uVar8 = vmovmskps_avx(auVar14);
        lVar12 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
          }
        }
        auVar7 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar35 = ZEXT3264(auVar7);
        auVar39 = ZEXT464(0) << 0x20;
        auVar14 = vpcmpeqd_avx(auVar42,auVar42);
        auVar43 = ZEXT1664(auVar14);
        auVar51 = ZEXT1664(CONCAT88(0x100000001,0x100000001));
        do {
          local_198 = &local_e8;
          local_1b8 = local_1d8;
          uVar8 = *(uint *)(local_f8 + lVar12 * 4);
          pRVar10 = (RayHitK<4> *)(ulong)uVar8;
          pGVar5 = (pSVar13->geometries).items[(long)pRVar10].ptr;
          if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            *(undefined4 *)(local_1e8 + lVar12 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar9 = *(undefined4 *)(local_158 + lVar12 * 4);
              uVar4 = *(undefined4 *)(local_158 + lVar12 * 4 + 0x10);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_138 + lVar12 * 4);
              *(float *)(ray + k * 4 + 0xc0) = local_118[lVar12 + -4];
              *(float *)(ray + k * 4 + 0xd0) = local_118[lVar12];
              *(float *)(ray + k * 4 + 0xe0) = local_108[lVar12];
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar9;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
              *(uint *)(ray + k * 4 + 0x110) = (Disc->primIDs).field_0.i[lVar12];
              *(uint *)(ray + k * 4 + 0x120) = uVar8;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              return;
            }
            local_b8 = *(undefined4 *)(local_158 + lVar12 * 4);
            local_a8 = *(undefined4 *)(local_158 + lVar12 * 4 + 0x10);
            local_88 = vpshufd_avx(ZEXT416(uVar8),0);
            local_98 = (Disc->primIDs).field_0.i[lVar12];
            fVar1 = local_118[lVar12 + -4];
            local_e8._4_4_ = fVar1;
            local_e8._0_4_ = fVar1;
            local_e8._8_4_ = fVar1;
            local_e8._12_4_ = fVar1;
            fVar1 = local_118[lVar12];
            local_d8._4_4_ = fVar1;
            local_d8._0_4_ = fVar1;
            local_d8._8_4_ = fVar1;
            local_d8._12_4_ = fVar1;
            fVar1 = local_108[lVar12];
            local_c8._4_4_ = fVar1;
            local_c8._0_4_ = fVar1;
            local_c8._8_4_ = fVar1;
            local_c8._12_4_ = fVar1;
            uStack_b4 = local_b8;
            uStack_b0 = local_b8;
            uStack_ac = local_b8;
            uStack_a4 = local_a8;
            uStack_a0 = local_a8;
            uStack_9c = local_a8;
            uStack_94 = local_98;
            uStack_90 = local_98;
            uStack_8c = local_98;
            uStack_74 = context->user->instID[0];
            local_78 = uStack_74;
            uStack_70 = uStack_74;
            uStack_6c = uStack_74;
            uStack_68 = context->user->instPrimID[0];
            uStack_64 = uStack_68;
            uStack_60 = uStack_68;
            uStack_5c = uStack_68;
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_138 + lVar12 * 4);
            local_1d8 = *(undefined1 (*) [16])
                         (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
            local_1b0 = pGVar5->userPtr;
            local_1a8 = context->user;
            local_190 = 4;
            pRVar10 = (RayHitK<4> *)pGVar5->intersectionFilterN;
            local_168 = auVar48._0_16_;
            local_178 = auVar50._0_16_;
            local_58 = auVar35._0_32_;
            local_188 = auVar51._0_16_;
            local_1c8 = context;
            local_1a0 = ray;
            if (pRVar10 != (RayHitK<4> *)0x0) {
              auVar14 = auVar43._0_16_;
              local_1c0 = pSVar13;
              pRVar10 = (RayHitK<4> *)(*(code *)pRVar10)(&local_1b8);
              auVar51 = ZEXT1664(local_188);
              auVar14 = vpcmpeqd_avx(auVar14,auVar14);
              auVar43 = ZEXT1664(auVar14);
              auVar39 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar35 = ZEXT3264(local_58);
              auVar34 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar50 = ZEXT1664(local_178);
              auVar48 = ZEXT1664(local_168);
              pSVar13 = local_1c0;
            }
            auVar14 = auVar43._0_16_;
            if (local_1d8 == (undefined1  [16])0x0) {
              auVar37 = vpcmpeqd_avx(auVar39._0_16_,(undefined1  [16])0x0);
              auVar14 = auVar14 ^ auVar37;
              context = local_1c8;
            }
            else {
              pRVar10 = (RayHitK<4> *)local_1c8->args->filter;
              if ((pRVar10 != (RayHitK<4> *)0x0) &&
                 (((local_1c8->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                pRVar10 = (RayHitK<4> *)(*(code *)pRVar10)();
                auVar51 = ZEXT1664(local_188);
                auVar14 = vpcmpeqd_avx(auVar14,auVar14);
                auVar43 = ZEXT1664(auVar14);
                auVar39 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar35 = ZEXT3264(local_58);
                auVar34 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar50 = ZEXT1664(local_178);
                auVar48 = ZEXT1664(local_168);
              }
              auVar37 = vpcmpeqd_avx(auVar39._0_16_,local_1d8);
              auVar14 = auVar43._0_16_ ^ auVar37;
              context = local_1c8;
              if (local_1d8 != (undefined1  [16])0x0) {
                auVar37 = auVar43._0_16_ ^ auVar37;
                auVar31 = vmaskmovps_avx(auVar37,*local_198);
                *(undefined1 (*) [16])(local_1a0 + 0xc0) = auVar31;
                auVar31 = vmaskmovps_avx(auVar37,local_198[1]);
                *(undefined1 (*) [16])(local_1a0 + 0xd0) = auVar31;
                auVar31 = vmaskmovps_avx(auVar37,local_198[2]);
                *(undefined1 (*) [16])(local_1a0 + 0xe0) = auVar31;
                auVar31 = vmaskmovps_avx(auVar37,local_198[3]);
                *(undefined1 (*) [16])(local_1a0 + 0xf0) = auVar31;
                auVar31 = vmaskmovps_avx(auVar37,local_198[4]);
                *(undefined1 (*) [16])(local_1a0 + 0x100) = auVar31;
                auVar31 = vmaskmovps_avx(auVar37,local_198[5]);
                *(undefined1 (*) [16])(local_1a0 + 0x110) = auVar31;
                auVar31 = vmaskmovps_avx(auVar37,local_198[6]);
                *(undefined1 (*) [16])(local_1a0 + 0x120) = auVar31;
                auVar31 = vmaskmovps_avx(auVar37,local_198[7]);
                *(undefined1 (*) [16])(local_1a0 + 0x130) = auVar31;
                auVar37 = vmaskmovps_avx(auVar37,local_198[8]);
                *(undefined1 (*) [16])(local_1a0 + 0x140) = auVar37;
                pRVar10 = local_1a0;
              }
            }
            if ((auVar51._0_16_ & auVar14) == (undefined1  [16])0x0) {
              *(int *)(ray + k * 4 + 0x80) = auVar50._0_4_;
            }
            else {
              auVar50 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
            }
            *(undefined4 *)(local_1e8 + lVar12 * 4) = 0;
            auVar14 = vshufps_avx(auVar50._0_16_,auVar50._0_16_,0);
            auVar14 = vcmpps_avx(auVar48._0_16_,auVar14,2);
            local_1e8 = vandps_avx(auVar14,local_1e8);
          }
          if ((((local_1e8 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (local_1e8 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (local_1e8 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < local_1e8[0xf]) {
            return;
          }
          auVar14 = vblendvps_avx(auVar34._0_16_,auVar48._0_16_,local_1e8);
          auVar37 = vshufps_avx(auVar14,auVar14,0xb1);
          auVar37 = vminps_avx(auVar37,auVar14);
          auVar31 = vshufpd_avx(auVar37,auVar37,1);
          auVar37 = vminps_avx(auVar31,auVar37);
          auVar37 = vcmpps_avx(auVar14,auVar37,0);
          auVar31 = local_1e8 & auVar37;
          auVar14 = local_1e8;
          if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar31[0xf] < '\0') {
            auVar14 = vandps_avx(auVar37,local_1e8);
          }
          uVar9 = vmovmskps_avx(auVar14);
          uVar11 = CONCAT44((int)((ulong)pRVar10 >> 0x20),uVar9);
          lVar12 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0,
            Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }